

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  SASL *sasl;
  short sVar2;
  connectdata *conn;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  char cVar6;
  byte bVar7;
  char *first;
  char *value;
  char *pcVar8;
  size_t len;
  
  conn = data->conn;
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = imap_statemachine;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).imapc.preftype = '\x03';
  sasl = &(conn->proto).imapc.sasl;
  Curl_sasl_init(sasl,data,&saslimap);
  Curl_dyn_init(&(conn->proto).imapc.dyn,0x10000);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  pcVar8 = conn->options;
  CVar5 = CURLE_OK;
  if ((pcVar8 != (char *)0x0) && (cVar6 = *pcVar8, first = pcVar8, cVar6 != '\0')) {
    do {
      while ((value = pcVar8 + 1, cVar6 != '\0' && (cVar6 != '='))) {
        pcVar8 = value;
        cVar6 = *value;
      }
      len = 0xffffffffffffffff;
      while ((cVar6 != '\0' && (cVar6 != ';'))) {
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
        len = len + 1;
        cVar6 = *pcVar1;
      }
      iVar3 = curl_strnequal(first,"AUTH=+LOGIN",0xb);
      if (iVar3 == 0) {
        iVar4 = curl_strnequal(first,"AUTH=",5);
        if (iVar4 == 0) {
          CVar5 = CURLE_URL_MALFORMAT;
          goto LAB_0013b2be;
        }
        CVar5 = Curl_sasl_parse_url_auth_option(sasl,value,len);
        if (CVar5 != CURLE_OK) goto LAB_0013b2be;
      }
      else {
        *(undefined2 *)((long)&conn->proto + 0xba) = 0;
      }
      first = pcVar8 + (*pcVar8 == ';');
      cVar6 = pcVar8[*pcVar8 == ';'];
      pcVar8 = first;
    } while (cVar6 != '\0');
    CVar5 = CURLE_OK;
    if (iVar3 != 0) {
      (conn->proto).imapc.preftype = '\x01';
      goto LAB_0013b2f3;
    }
  }
LAB_0013b2be:
  sVar2 = *(short *)((long)&conn->proto + 0xba);
  bVar7 = sVar2 == -0x21 | 2;
  if (sVar2 == 0) {
    bVar7 = 0;
  }
  (conn->proto).imapc.preftype = bVar7;
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
LAB_0013b2f3:
  (data->conn->proto).imapc.state = IMAP_SERVERGREET;
  *(undefined2 *)((long)&conn->proto + 0xf4) = 0x2a;
  CVar5 = imap_multi_statemach(data,done);
  return CVar5;
}

Assistant:

static CURLcode imap_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  PINGPONG_SETUP(pp, imap_statemachine, imap_endofresp);

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, data, &saslimap);

  Curl_dyn_init(&imapc->dyn, DYN_IMAP_CMD);
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  imap_state(data, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(data, done);

  return result;
}